

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksToSubprojects
          (cmExtraEclipseCDT4Generator *this,cmXMLWriter *xml,string *baseDir)

{
  cmGlobalGenerator *pcVar1;
  bool bVar2;
  string *psVar3;
  _Base_ptr p_Var4;
  cmAlphaNum local_d0;
  cmAlphaNum local_a0;
  string linkName;
  string linkSourceDirectory;
  
  if (this->GenerateLinkedResources == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"[Subprojects]",(allocator<char> *)&linkSourceDirectory);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"virtual:/virtual",(allocator<char> *)&linkName);
    AppendLinkedResource(xml,(string *)&local_a0,(string *)&local_d0,VirtualFolder);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_a0);
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    for (p_Var4 = (pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      psVar3 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_
                         ((cmLocalGenerator *)**(undefined8 **)(p_Var4 + 2));
      std::__cxx11::string::string((string *)&linkSourceDirectory,(string *)psVar3);
      bVar2 = std::operator!=(baseDir,&linkSourceDirectory);
      if (bVar2) {
        bVar2 = cmsys::SystemTools::IsSubDirectory(baseDir,&linkSourceDirectory);
        if (!bVar2) {
          local_a0.View_._M_len = 0xe;
          local_a0.View_._M_str = "[Subprojects]/";
          local_d0.View_._M_str = *(char **)(p_Var4 + 1);
          local_d0.View_._M_len = (size_t)p_Var4[1]._M_parent;
          cmStrCat<>(&linkName,&local_a0,&local_d0);
          std::__cxx11::string::string((string *)&local_a0,(string *)&linkSourceDirectory);
          AppendLinkedResource(xml,&linkName,(string *)&local_a0,LinkToFolder);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&linkName);
        }
      }
      std::__cxx11::string::~string((string *)&linkSourceDirectory);
    }
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksToSubprojects(
  cmXMLWriter& xml, const std::string& baseDir)
{
  if (!this->GenerateLinkedResources) {
    return;
  }

  // for each sub project create a linked resource to the source dir
  // - only if it is an out-of-source build
  cmExtraEclipseCDT4Generator::AppendLinkedResource(
    xml, "[Subprojects]", "virtual:/virtual", VirtualFolder);

  for (auto const& it : this->GlobalGenerator->GetProjectMap()) {
    std::string linkSourceDirectory =
      cmExtraEclipseCDT4Generator::GetEclipsePath(
        it.second[0]->GetCurrentSourceDirectory());
    // a linked resource must not point to a parent directory of .project or
    // .project itself
    if ((baseDir != linkSourceDirectory) &&
        !cmSystemTools::IsSubDirectory(baseDir, linkSourceDirectory)) {
      std::string linkName = cmStrCat("[Subprojects]/", it.first);
      cmExtraEclipseCDT4Generator::AppendLinkedResource(
        xml, linkName,
        cmExtraEclipseCDT4Generator::GetEclipsePath(linkSourceDirectory),
        LinkToFolder);
      // Don't add it to the srcLinkedResources, because listing multiple
      // directories confuses the Eclipse indexer (#13596).
    }
  }
}